

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O3

void __thiscall
Expression::Expression(Expression *this,BotscriptParser *parser,Lexer *lx,DataType reqtype)

{
  iterator *piVar1;
  _Elt_pointer ppEVar2;
  _Map_pointer pppEVar3;
  ExpressionSymbol *in_RAX;
  uint uVar4;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *args;
  uchar *in_R8;
  size_t in_R9;
  ExpressionSymbol *sym;
  ExpressionSymbol *local_38;
  size_t siglen;
  
  this->m_parser = parser;
  this->m_lexer = lx;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_symbols)._deque.
  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ctx = (EVP_PKEY_CTX *)0x0;
  local_38 = in_RAX;
  std::_Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>::_M_initialize_map
            ((_Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_> *)
             &this->m_symbols,0);
  this->m_type = reqtype;
  args = (EVP_PKEY_CTX *)&this->m_badTokenText;
  (this->m_badTokenText)._string._M_dataplus._M_p = (pointer)&(this->m_badTokenText)._string.field_2
  ;
  (this->m_badTokenText)._string._M_string_length = 0;
  (this->m_badTokenText)._string.field_2._M_local_buf[0] = '\0';
  while( true ) {
    local_38 = parseSymbol(this);
    if (local_38 == (ExpressionSymbol *)0x0) break;
    ppEVar2 = (this->m_symbols)._deque.
              super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppEVar2 ==
        (this->m_symbols)._deque.
        super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      ctx = (EVP_PKEY_CTX *)&local_38;
      std::deque<ExpressionSymbol*,std::allocator<ExpressionSymbol*>>::
      _M_push_back_aux<ExpressionSymbol*const&>
                ((deque<ExpressionSymbol*,std::allocator<ExpressionSymbol*>> *)&this->m_symbols,
                 &local_38);
    }
    else {
      *ppEVar2 = local_38;
      piVar1 = &(this->m_symbols)._deque.
                super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  pppEVar3 = (this->m_symbols)._deque.
             super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  uVar4 = (int)((ulong)((long)(this->m_symbols)._deque.
                              super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_symbols)._deque.
                             super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) +
          ((((uint)((int)pppEVar3 -
                   *(int *)&(this->m_symbols)._deque.
                            super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (uint)(pppEVar3 == (_Map_pointer)0x0)) * 0x40;
  siglen = (size_t)uVar4;
  if ((int)((ulong)((long)(this->m_symbols)._deque.
                          super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)(this->m_symbols)._deque.
                         super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) + uVar4 == 0) {
    error<String>("unknown identifier \'%1\'",(String *)args);
    ctx = args;
  }
  adjustOperators(this);
  verify(this,ctx,sig,siglen,in_R8,in_R9);
  evaluate(this);
  return;
}

Assistant:

Expression::Expression (BotscriptParser* parser, Lexer* lx, DataType reqtype) :
	m_parser (parser),
	m_lexer (lx),
	m_type (reqtype)
{
	ExpressionSymbol* sym;

	while ((sym = parseSymbol()) != null)
		m_symbols << sym;

	// If we were unable to get any expression symbols, something's wonky with
	// the script. Report an error. mBadTokenText is set to the token that
	// ParseSymbol ends at when it returns false.
	if (m_symbols.isEmpty())
		error ("unknown identifier '%1'", m_badTokenText);

	adjustOperators();
	verify();
	evaluate();
}